

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O3

lzma_ret lzma_decoder_init(lzma_lz_decoder_conflict1 *lz,lzma_allocator *allocator,void *options,
                          lzma_lz_options *lz_options)

{
  lzma_ret lVar1;
  
  lVar1 = LZMA_PROG_ERROR;
  if (((*(uint *)((long)options + 0x14) < 5) &&
      (*(uint *)((long)options + 0x14) + *(uint *)((long)options + 0x18) < 5 &&
       *(uint *)((long)options + 0x18) < 5)) && (*(uint *)((long)options + 0x1c) < 5)) {
    lVar1 = lzma_lzma_decoder_create(lz,allocator,options,lz_options);
    if (lVar1 == LZMA_OK) {
      lzma_decoder_reset(lz->coder,options);
      lz->coder->uncompressed_size = 0xffffffffffffffff;
      lVar1 = LZMA_OK;
    }
  }
  return lVar1;
}

Assistant:

static lzma_ret
lzma_decoder_init(lzma_lz_decoder *lz, lzma_allocator *allocator,
		const void *options, lzma_lz_options *lz_options)
{
	if (!is_lclppb_valid(options))
		return LZMA_PROG_ERROR;

	return_if_error(lzma_lzma_decoder_create(
			lz, allocator, options, lz_options));

	lzma_decoder_reset(lz->coder, options);
	lzma_decoder_uncompressed(lz->coder, LZMA_VLI_UNKNOWN);

	return LZMA_OK;
}